

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void readRFA(string *fileName,adjacencyType *adjVec,startStatesType *startStates,
            finalStatesType *finalStates,int *numOfStates)

{
  int iVar1;
  iterator __position;
  _Alloc_hider __nptr;
  bool bVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
  _Var7;
  ostream *poVar8;
  char delim;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar10;
  int numOfStateInDef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  states;
  string curString;
  string label;
  regex ruleRegex;
  regex isStart;
  smatch res;
  regex numberInStateDefRegex;
  regex hasLabel;
  regex isFinal;
  ifstream fileStream;
  int local_38c;
  string_type local_388;
  string local_360;
  value_type local_340;
  undefined1 local_320 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  adjacencyType *local_2f0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
  *local_2e8;
  _Rb_tree<int,std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  *local_2e0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2d8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2b8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_298;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_278;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_258;
  long local_238 [65];
  
  local_2e8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
               *)finalStates;
  local_2e0 = (_Rb_tree<int,std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
               *)startStates;
  anon_unknown.dwarf_29a00::openFile((anon_unknown_dwarf_29a00 *)local_238,fileName);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_320,"[0-9]+",0x10);
  anon_unknown.dwarf_29a00::skipUntilRegex(&local_360,(ifstream *)local_238,(regex *)local_320);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_320);
  anon_unknown.dwarf_29a00::split
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_320,&local_360,delim);
  *numOfStates = (int)((ulong)(local_320._8_8_ - local_320._0_8_) >> 5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_320);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2d8,"([0-9]+)([[])",0x10);
  anon_unknown.dwarf_29a00::skipUntilRegex((string *)local_320,(ifstream *)local_238,&local_2d8);
  std::__cxx11::string::operator=((string *)&local_360,(string *)local_320);
  if ((pointer)local_320._0_8_ != (pointer)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_,(ulong)(local_320._16_8_ + 1));
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_2d8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_320,"(->)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2d8,"(color=)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_258,"(shape=)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_278,"(label=\")([^\"]+)",0x10);
  local_300._8_8_ = numOfStates;
  local_2f0 = adjVec;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_298,"([0-9]+)",0x10);
  local_2b8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._M_begin._M_current = (char *)0x0;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_360._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_360._M_dataplus._M_p + local_360._M_string_length),&local_2b8,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_320,0);
    if (bVar2) {
      local_388._M_dataplus._M_p = (pointer)0x0;
      local_388._M_string_length = 0;
      local_388.field_2._M_allocated_capacity = 0;
      anon_unknown.dwarf_29a00::readEdges
                ((ifstream *)local_238,local_2f0,*(uint *)local_300._8_8_,&local_360,
                 (vector<edge,_std::allocator<edge>_> *)&local_388);
      std::ifstream::close();
      std::vector<edge,_std::allocator<edge>_>::~vector
                ((vector<edge,_std::allocator<edge>_> *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      if (local_2b8.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_298);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_278);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_258);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_2d8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    if (local_360._M_string_length != 0) break;
LAB_00105dab:
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_360,cVar3);
  }
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_360._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_360._M_dataplus._M_p + local_360._M_string_length),&local_2b8,
                     &local_298,0);
  if (bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_388,&local_2b8,1);
    __nptr._M_p = local_388._M_dataplus._M_p;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(__nptr._M_p,(char **)&local_300._M_allocated_capacity,10);
    if ((pointer)local_300._M_allocated_capacity == __nptr._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else {
      iVar4 = (int)lVar6;
      if ((iVar4 != lVar6) || (*piVar5 == 0x22)) {
        std::__throw_out_of_range("stoi");
        goto LAB_00105f38;
      }
      if (*piVar5 == 0) {
        *piVar5 = iVar1;
      }
      local_38c = iVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      bVar2 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_360._M_dataplus._M_p,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_360._M_dataplus._M_p + local_360._M_string_length),&local_2b8,
                         &local_278,0);
      if (bVar2) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_388,&local_2b8,2);
        std::__cxx11::string::operator=((string *)&local_340,(string *)&local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        bVar2 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_360._M_dataplus._M_p,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_360._M_dataplus._M_p + local_360._M_string_length),&local_2b8,
                           &local_2d8,0);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_388,1,&local_340,(allocator_type *)local_300._M_local_buf);
          pVar9 = std::
                  _Rb_tree<int,std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ::
                  _M_emplace_unique<int&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                            (local_2e0,&local_38c,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_388);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&pVar9.first._M_node._M_node[1]._M_parent,&local_340);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_388);
        }
        bVar2 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_360._M_dataplus._M_p,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_360._M_dataplus._M_p + local_360._M_string_length),&local_2b8,
                           &local_258,0);
        if (bVar2) {
          local_388._M_dataplus._M_p = (pointer)0x0;
          local_388._M_string_length = 0;
          local_388.field_2._M_allocated_capacity = 0;
          local_388._M_dataplus._M_p = (pointer)operator_new(4);
          local_388._M_string_length = (long)local_388._M_dataplus._M_p + 4;
          *(int *)local_388._M_dataplus._M_p = local_38c;
          local_388.field_2._M_allocated_capacity = local_388._M_string_length;
          pVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                   ::_M_emplace_unique<std::__cxx11::string&,std::vector<int,std::allocator<int>>&>
                             (local_2e8,&local_340,(vector<int,_std::allocator<int>_> *)&local_388);
          _Var7 = pVar10.first._M_node;
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __position._M_current = (int *)_Var7._M_node[2]._M_parent;
            if ((_Base_ptr)__position._M_current == _Var7._M_node[2]._M_left) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)(_Var7._M_node + 2),__position,
                         &local_38c);
            }
            else {
              *__position._M_current = local_38c;
              _Var7._M_node[2]._M_parent = (_Base_ptr)(__position._M_current + 1);
            }
          }
          if ((int *)local_388._M_dataplus._M_p != (int *)0x0) {
            operator_delete(local_388._M_dataplus._M_p,
                            local_388.field_2._M_allocated_capacity -
                            (long)local_388._M_dataplus._M_p);
          }
        }
        goto LAB_00105dab;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Expected label= in string ",0x1a);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_360._M_dataplus._M_p,local_360._M_string_length)
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
LAB_00105f38:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Incorrect format of state definition, expected X[label=\"Y\", ...], got ",0x46);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_360._M_dataplus._M_p,local_360._M_string_length)
    ;
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  exit(1);
}

Assistant:

void readRFA(const string & fileName,
             adjacencyType & adjVec,
             startStatesType & startStates,
             finalStatesType & finalStates,
             int & numOfStates)
{
    ifstream fileStream = openFile(fileName);

    // get number of states
    string curString = skipUntilRegex(fileStream, regex("[0-9]+"));
    numOfStates = static_cast<int>(split(curString, ';').size());

    // parse info about start and final states
    curString = skipUntilRegex(fileStream, regex("([0-9]+)([[])"));

    regex ruleRegex ("(->)");
    regex isStart ("(color=)");
    regex isFinal ("(shape=)");
    regex hasLabel ("(label=\")([^\"]+)");
    regex numberInStateDefRegex ("([0-9]+)");
    smatch res;
    string label;
    int numOfStateInDef;

    while ( ! regex_search(curString, res, ruleRegex)) {
        if ( ! curString.empty()) {
            if (regex_search(curString, res, numberInStateDefRegex)) {
                numOfStateInDef = stoi(res.str(1));
            } else {
                cout << "Incorrect format of state definition, expected X[label=\"Y\", ...], got "
                     << curString << endl;
                exit(1);
            }

            if (regex_search(curString, res, hasLabel)) {
                label = res.str(2);
                // this map state -> nonterminal
                if (regex_search(curString, res, isStart)) {
                    auto states = vector<string>(1, label);
                    auto emplaceResult = startStates.emplace(numOfStateInDef, states);
                    if ( ! emplaceResult.second) {
                        auto iter = emplaceResult.first;
                        (*iter).second.push_back(label);
                    }
                }

                // this map nonterminal -> state
                if (regex_search(curString, res, isFinal)) {
                    auto states = vector<int>(1, numOfStateInDef);
                    auto emplaceResult = finalStates.emplace(label, states);
                    if ( ! emplaceResult.second) {
                        auto iter = emplaceResult.first;
                        (*iter).second.push_back(numOfStateInDef);
                    }
                }
            } else {
                cout << "Expected label= in string " << curString << endl;
                exit(1);
            }
        }
        getline(fileStream, curString);
    }
    vector<edge> dummy = vector<edge>(0);
    readEdges(fileStream, adjVec, static_cast<unsigned int>(numOfStates), curString, dummy);
    fileStream.close();
}